

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleGenerateCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  undefined1 local_188 [8];
  string input;
  string local_160;
  byte local_139;
  undefined1 local_138 [7];
  bool inputIsContent;
  string output;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined4 local_c8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string condition;
  string local_78;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Incorrect arguments to GENERATE subcommand.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_0029fe9a;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,1);
  bVar1 = std::operator!=(pvVar3,"OUTPUT");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Incorrect arguments to GENERATE subcommand.",
               (allocator<char> *)(condition.field_2._M_local_buf + 0xf));
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(condition.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 0;
    goto LAB_0029fe9a;
  }
  std::__cxx11::string::string((string *)local_a0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar2 < 6) {
LAB_0029fc94:
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,2);
    std::__cxx11::string::string((string *)local_138,(string *)pvVar3);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,3);
    local_139 = std::operator!=(pvVar3,"INPUT");
    if ((bool)local_139) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,3);
      bVar1 = std::operator!=(pvVar3,"CONTENT");
      if (!bVar1) goto LAB_0029fdde;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Incorrect arguments to GENERATE subcommand.",
                 (allocator<char> *)(input.field_2._M_local_buf + 0xf));
      cmCommand::SetError(&this->super_cmCommand,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      local_c8 = 1;
    }
    else {
LAB_0029fdde:
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,4);
      std::__cxx11::string::string((string *)local_188,(string *)pvVar3);
      AddEvaluationFile(this,(string *)local_188,(string *)local_138,(string *)local_a0,
                        (bool)(local_139 & 1));
      this_local._7_1_ = 1;
      local_c8 = 1;
      std::__cxx11::string::~string((string *)local_188);
    }
    std::__cxx11::string::~string((string *)local_138);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,5);
    bVar1 = std::operator!=(pvVar3,"CONDITION");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Incorrect arguments to GENERATE subcommand.",&local_c1);
      cmCommand::SetError(&this->super_cmCommand,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      this_local._7_1_ = 0;
      local_c8 = 1;
    }
    else {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar2 == 7) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,6);
        std::__cxx11::string::operator=((string *)local_a0,(string *)pvVar3);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) goto LAB_0029fc94;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,
                   "CONDITION of sub-command GENERATE must not be empty if specified.",
                   (allocator<char> *)(output.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        local_c8 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Incorrect arguments to GENERATE subcommand.",&local_e9);
        cmCommand::SetError(&this->super_cmCommand,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        this_local._7_1_ = 0;
        local_c8 = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_a0);
LAB_0029fe9a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleGenerateCommand(std::vector<std::string> const& args)
{
  if (args.size() < 5) {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  if (args[1] != "OUTPUT") {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  std::string condition;
  if (args.size() > 5) {
    if (args[5] != "CONDITION") {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
    }
    if (args.size() != 7) {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
    }
    condition = args[6];
    if (condition.empty()) {
      this->SetError("CONDITION of sub-command GENERATE must not be empty if "
                     "specified.");
      return false;
    }
  }
  std::string output = args[2];
  const bool inputIsContent = args[3] != "INPUT";
  if (inputIsContent && args[3] != "CONTENT") {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  std::string input = args[4];

  this->AddEvaluationFile(input, output, condition, inputIsContent);
  return true;
}